

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O0

int64_t __thiscall
aeron::DriverProxy::addDestination
          (DriverProxy *this,int64_t publicationRegistrationId,string *channel)

{
  int64_t iVar1;
  int64_t correlationId;
  anon_class_32_4_88066e9b *in_stack_000002a8;
  DriverProxy *in_stack_000002b0;
  
  iVar1 = concurrent::ringbuffer::ManyToOneRingBuffer::nextCorrelationId
                    ((ManyToOneRingBuffer *)0x1fe5e4);
  writeCommandToDriver<aeron::DriverProxy::addDestination(long,std::__cxx11::string_const&)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (in_stack_000002b0,in_stack_000002a8);
  return iVar1;
}

Assistant:

std::int64_t addDestination(std::int64_t publicationRegistrationId, const std::string& channel)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            DestinationMessageFlyweight addMessage(buffer, 0);

            addMessage.clientId(m_clientId);
            addMessage.registrationId(publicationRegistrationId);
            addMessage.correlationId(correlationId);
            addMessage.channel(channel);

            length = addMessage.length();

            return ControlProtocolEvents::ADD_DESTINATION;
        });

        return correlationId;
    }